

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareUnitsEquivalentSameBaseTwice_Test::~Units_compareUnitsEquivalentSameBaseTwice_Test
          (Units_compareUnitsEquivalentSameBaseTwice_Test *this)

{
  Units_compareUnitsEquivalentSameBaseTwice_Test *this_local;
  
  ~Units_compareUnitsEquivalentSameBaseTwice_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compareUnitsEquivalentSameBaseTwice)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit(libcellml::Units::StandardUnit::CANDELA, "micro", 2.0, 3.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("u");
    u1->addUnit("u");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("u");
    u2->addUnit("u");

    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");
    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_TRUE(libcellml::Units::compatible(u1, u2));
    EXPECT_TRUE(libcellml::Units::compatible(u2, u1));
}